

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmComputeLinkInformation.cxx
# Opt level: O2

bool __thiscall cmComputeLinkInformation::Compute(cmComputeLinkInformation *this)

{
  cmGeneratorTarget *pcVar1;
  cmake *this_00;
  bool bVar2;
  TargetType TVar3;
  vector<cmComputeLinkDepends::LinkEntry,_std::allocator<cmComputeLinkDepends::LinkEntry>_> *pvVar4;
  char *val;
  string *psVar5;
  _Base_ptr p_Var6;
  ostream *poVar7;
  ArtifactType artifact;
  PolicyID id;
  LinkType lt;
  pointer item;
  string local_470;
  string *local_450;
  string *local_448;
  string local_440;
  string lib;
  cmComputeLinkDepends cld;
  
  TVar3 = cmGeneratorTarget::GetType(this->Target);
  if ((((TVar3 != EXECUTABLE) &&
       (TVar3 = cmGeneratorTarget::GetType(this->Target), TVar3 != SHARED_LIBRARY)) &&
      (TVar3 = cmGeneratorTarget::GetType(this->Target), TVar3 != MODULE_LIBRARY)) &&
     (TVar3 = cmGeneratorTarget::GetType(this->Target), TVar3 != STATIC_LIBRARY)) {
    return false;
  }
  if ((this->LinkLanguage)._M_string_length == 0) {
    psVar5 = cmGeneratorTarget::GetName_abi_cxx11_(this->Target);
    bVar2 = false;
    cmSystemTools::Error
              ("CMake can not determine linker language for target: ",(psVar5->_M_dataplus)._M_p,
               (char *)0x0,(char *)0x0);
  }
  else {
    local_448 = &this->Config;
    cmComputeLinkDepends::cmComputeLinkDepends(&cld,this->Target,local_448);
    cmComputeLinkDepends::SetOldLinkDirMode(&cld,this->OldLinkDirMode);
    pvVar4 = cmComputeLinkDepends::Compute(&cld);
    local_450 = (string *)&this->LinkLanguage;
    for (item = (pvVar4->
                super__Vector_base<cmComputeLinkDepends::LinkEntry,_std::allocator<cmComputeLinkDepends::LinkEntry>_>
                )._M_impl.super__Vector_impl_data._M_start;
        item != (pvVar4->
                super__Vector_base<cmComputeLinkDepends::LinkEntry,_std::allocator<cmComputeLinkDepends::LinkEntry>_>
                )._M_impl.super__Vector_impl_data._M_finish; item = item + 1) {
      if (item->IsSharedDep == true) {
        AddSharedDepItem(this,&item->Item,item->Target);
      }
      else {
        AddItem(this,&item->Item,item->Target);
      }
    }
    pcVar1 = this->Target;
    std::__cxx11::string::string((string *)&lib,"LINK_SEARCH_END_STATIC",(allocator *)&local_470);
    val = cmGeneratorTarget::GetProperty(pcVar1,&lib);
    std::__cxx11::string::~string((string *)&lib);
    bVar2 = cmSystemTools::IsOn(val);
    if (bVar2) {
      lt = LinkStatic;
    }
    else {
      lt = this->StartLinkType;
    }
    SetCurrentLinkType(this,lt);
    if (this->OldLinkDirMode == true) {
      for (p_Var6 = cld.OldWrongConfigItems._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
          (_Rb_tree_header *)p_Var6 != &cld.OldWrongConfigItems._M_t._M_impl.super__Rb_tree_header;
          p_Var6 = (_Base_ptr)std::_Rb_tree_increment(p_Var6)) {
        pcVar1 = *(cmGeneratorTarget **)(p_Var6 + 1);
        artifact = RuntimeBinaryArtifact;
        if (this->UseImportLibrary == true) {
          TVar3 = cmGeneratorTarget::GetType(pcVar1);
          artifact = (ArtifactType)(TVar3 == SHARED_LIBRARY);
        }
        cmGeneratorTarget::GetFullPath(&lib,pcVar1,local_448,artifact,true);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(&this->OldLinkDirItems,&lib);
        std::__cxx11::string::~string((string *)&lib);
      }
    }
    bVar2 = FinishLinkerSearchDirectories(this);
    if ((bVar2) &&
       (AddImplicitLinkInfo(this),
       (this->CMP0060WarnItems)._M_t._M_impl.super__Rb_tree_header._M_node_count != 0)) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&lib);
      cmPolicies::GetPolicyWarning_abi_cxx11_(&local_470,(cmPolicies *)0x3c,id);
      poVar7 = std::operator<<((ostream *)&lib,(string *)&local_470);
      poVar7 = std::operator<<(poVar7,
                               "\nSome library files are in directories implicitly searched by the linker when invoked for "
                              );
      poVar7 = std::operator<<(poVar7,local_450);
      poVar7 = std::operator<<(poVar7,":\n ");
      cmJoin<std::set<std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>>
                (&local_440,&this->CMP0060WarnItems,"\n ");
      poVar7 = std::operator<<(poVar7,(string *)&local_440);
      std::operator<<(poVar7,
                      "\nFor compatibility with older versions of CMake, the generated link line will ask the linker to search for these by library name."
                     );
      std::__cxx11::string::~string((string *)&local_440);
      std::__cxx11::string::~string((string *)&local_470);
      this_00 = this->CMakeInstance;
      std::__cxx11::stringbuf::str();
      cmGeneratorTarget::GetBacktrace((cmListFileBacktrace *)&local_440,this->Target);
      cmake::IssueMessage(this_00,AUTHOR_WARNING,&local_470,(cmListFileBacktrace *)&local_440);
      cmListFileBacktrace::~cmListFileBacktrace((cmListFileBacktrace *)&local_440);
      std::__cxx11::string::~string((string *)&local_470);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&lib);
    }
    cmComputeLinkDepends::~cmComputeLinkDepends(&cld);
  }
  return bVar2;
}

Assistant:

bool cmComputeLinkInformation::Compute()
{
  // Skip targets that do not link.
  if (!(this->Target->GetType() == cmStateEnums::EXECUTABLE ||
        this->Target->GetType() == cmStateEnums::SHARED_LIBRARY ||
        this->Target->GetType() == cmStateEnums::MODULE_LIBRARY ||
        this->Target->GetType() == cmStateEnums::STATIC_LIBRARY)) {
    return false;
  }

  // We require a link language for the target.
  if (this->LinkLanguage.empty()) {
    cmSystemTools::Error(
      "CMake can not determine linker language for target: ",
      this->Target->GetName().c_str());
    return false;
  }

  // Compute the ordered link line items.
  cmComputeLinkDepends cld(this->Target, this->Config);
  cld.SetOldLinkDirMode(this->OldLinkDirMode);
  cmComputeLinkDepends::EntryVector const& linkEntries = cld.Compute();

  // Add the link line items.
  for (cmComputeLinkDepends::EntryVector::const_iterator lei =
         linkEntries.begin();
       lei != linkEntries.end(); ++lei) {
    if (lei->IsSharedDep) {
      this->AddSharedDepItem(lei->Item, lei->Target);
    } else {
      this->AddItem(lei->Item, lei->Target);
    }
  }

  // Restore the target link type so the correct system runtime
  // libraries are found.
  const char* lss = this->Target->GetProperty("LINK_SEARCH_END_STATIC");
  if (cmSystemTools::IsOn(lss)) {
    this->SetCurrentLinkType(LinkStatic);
  } else {
    this->SetCurrentLinkType(this->StartLinkType);
  }

  // Finish listing compatibility paths.
  if (this->OldLinkDirMode) {
    // For CMake 2.4 bug-compatibility we need to consider the output
    // directories of targets linked in another configuration as link
    // directories.
    std::set<cmGeneratorTarget const*> const& wrongItems =
      cld.GetOldWrongConfigItems();
    for (std::set<cmGeneratorTarget const*>::const_iterator i =
           wrongItems.begin();
         i != wrongItems.end(); ++i) {
      cmGeneratorTarget const* tgt = *i;
      bool implib = (this->UseImportLibrary &&
                     (tgt->GetType() == cmStateEnums::SHARED_LIBRARY));
      cmStateEnums::ArtifactType artifact = implib
        ? cmStateEnums::ImportLibraryArtifact
        : cmStateEnums::RuntimeBinaryArtifact;
      std::string lib = tgt->GetFullPath(this->Config, artifact, true);
      this->OldLinkDirItems.push_back(lib);
    }
  }

  // Finish setting up linker search directories.
  if (!this->FinishLinkerSearchDirectories()) {
    return false;
  }

  // Add implicit language runtime libraries and directories.
  this->AddImplicitLinkInfo();

  if (!this->CMP0060WarnItems.empty()) {
    std::ostringstream w;
    /* clang-format off */
    w << cmPolicies::GetPolicyWarning(cmPolicies::CMP0060) << "\n"
      "Some library files are in directories implicitly searched by "
      "the linker when invoked for " << this->LinkLanguage << ":\n"
      " " << cmJoin(this->CMP0060WarnItems, "\n ") << "\n"
      "For compatibility with older versions of CMake, the generated "
      "link line will ask the linker to search for these by library "
      "name."
      ;
    /* clang-format on */
    this->CMakeInstance->IssueMessage(cmake::AUTHOR_WARNING, w.str(),
                                      this->Target->GetBacktrace());
  }

  return true;
}